

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.c++
# Opt level: O3

void __thiscall
kj::ExceptionCallback::RootExceptionCallback::logMessage
          (RootExceptionCallback *this,LogSeverity severity,char *file,int line,int contextDepth,
          String *text)

{
  ArrayDisposer *pAVar1;
  ssize_t sVar2;
  char *pcVar3;
  size_t sVar4;
  undefined7 in_stack_ffffffffffffffa8;
  int line_local;
  LogSeverity severity_local;
  String local_48;
  char *file_local;
  kj local_28 [8];
  long local_20;
  
  local_20 = (long)contextDepth;
  local_28[0] = (kj)0x5f;
  line_local = line;
  severity_local = severity;
  file_local = file;
  str<kj::Repeat<char>,char_const*&,char_const(&)[2],int&,char_const(&)[3],kj::LogSeverity&,char_const(&)[3],kj::String,char>
            (&local_48,local_28,(Repeat<char> *)&file_local,(char **)0x1808e4,
             (char (*) [2])&line_local,(int *)0x1918f7,(char (*) [3])&severity_local,
             (LogSeverity *)0x1918f7,(char (*) [3])text,(String *)&stack0xffffffffffffffaf,
             (char *)CONCAT17(10,in_stack_ffffffffffffffa8));
  pcVar3 = (text->content).ptr;
  if (pcVar3 != (char *)0x0) {
    sVar4 = (text->content).size_;
    pAVar1 = (text->content).disposer;
    (text->content).ptr = (char *)0x0;
    (text->content).size_ = 0;
    (*(code *)**(undefined8 **)pAVar1)(pAVar1,pcVar3,1,sVar4,sVar4,0);
  }
  (text->content).ptr = local_48.content.ptr;
  (text->content).size_ = local_48.content.size_;
  (text->content).disposer = local_48.content.disposer;
  pcVar3 = local_48.content.ptr;
  sVar4 = local_48.content.size_;
  while( true ) {
    if (sVar4 < 2) {
      return;
    }
    sVar2 = write(2,pcVar3,sVar4 - 1);
    if (sVar2 < 1) break;
    pcVar3 = pcVar3 + sVar2;
    sVar4 = sVar4 - sVar2;
  }
  return;
}

Assistant:

void logMessage(LogSeverity severity, const char* file, int line, int contextDepth,
                  String&& text) override {
    text = str(kj::repeat('_', contextDepth), file, ":", line, ": ", severity, ": ",
               mv(text), '\n');

    StringPtr textPtr = text;

    while (textPtr != nullptr) {
      miniposix::ssize_t n = miniposix::write(STDERR_FILENO, textPtr.begin(), textPtr.size());
      if (n <= 0) {
        // stderr is broken.  Give up.
        return;
      }
      textPtr = textPtr.slice(n);
    }
  }